

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O2

QString * __thiscall
QTimeZonePrivate::displayName
          (QString *__return_storage_ptr__,QTimeZonePrivate *this,qint64 atMSecsSinceEpoch,
          NameType nameType,QLocale *locale)

{
  long lVar1;
  Data *pDVar2;
  bool bVar3;
  int iVar4;
  long in_FS_OFFSET;
  Data tran;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tran.offsetFromUtc = -0x55555556;
  tran.standardTimeOffset = -0x55555556;
  tran.daylightTimeOffset = -0x55555556;
  tran._44_4_ = 0xaaaaaaaa;
  tran.abbreviation.d.size._0_4_ = 0xaaaaaaaa;
  tran.abbreviation.d.size._4_4_ = 0xaaaaaaaa;
  tran.atMSecsSinceEpoch._0_4_ = 0xaaaaaaaa;
  tran.atMSecsSinceEpoch._4_4_ = 0xaaaaaaaa;
  tran.abbreviation.d.d._0_4_ = 0xaaaaaaaa;
  tran.abbreviation.d.d._4_4_ = 0xaaaaaaaa;
  tran.abbreviation.d.ptr._0_4_ = 0xaaaaaaaa;
  tran.abbreviation.d.ptr._4_4_ = 0xaaaaaaaa;
  (*this->_vptr_QTimeZonePrivate[0xd])(&tran);
  if (nameType == ShortName) {
    iVar4 = (*this->_vptr_QTimeZonePrivate[0xf])(this,locale);
    if ((char)iVar4 != '\0') {
      pDVar2 = (Data *)CONCAT44(tran.abbreviation.d.d._4_4_,tran.abbreviation.d.d._0_4_);
      (__return_storage_ptr__->d).d = pDVar2;
      (__return_storage_ptr__->d).ptr =
           (char16_t *)CONCAT44(tran.abbreviation.d.ptr._4_4_,tran.abbreviation.d.ptr._0_4_);
      (__return_storage_ptr__->d).size =
           CONCAT44(tran.abbreviation.d.size._4_4_,(undefined4)tran.abbreviation.d.size);
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_003aa9bd;
    }
  }
  else if ((nameType == OffsetName) && (bVar3 = isAnglicLocale(locale), bVar3)) {
    isoOffsetFormat(__return_storage_ptr__,tran.offsetFromUtc,OffsetName);
    goto LAB_003aa9bd;
  }
  localeName(__return_storage_ptr__,this,atMSecsSinceEpoch,tran.offsetFromUtc,
             (uint)(tran.daylightTimeOffset != 0),nameType,locale);
LAB_003aa9bd:
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tran);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QTimeZonePrivate::displayName(qint64 atMSecsSinceEpoch,
                                      QTimeZone::NameType nameType,
                                      const QLocale &locale) const
{
    const Data tran = data(atMSecsSinceEpoch);
    if (tran.atMSecsSinceEpoch != invalidMSecs()) {
        if (nameType == QTimeZone::OffsetName && isAnglicLocale(locale))
            return isoOffsetFormat(tran.offsetFromUtc);
        if (nameType == QTimeZone::ShortName && isDataLocale(locale))
            return tran.abbreviation;

        QTimeZone::TimeType timeType
            = tran.daylightTimeOffset != 0 ? QTimeZone::DaylightTime : QTimeZone::StandardTime;
#if QT_CONFIG(timezone_locale)
        return localeName(atMSecsSinceEpoch, tran.offsetFromUtc, timeType, nameType, locale);
#else
        return displayName(timeType, nameType, locale);
#endif
    }
    return QString();
}